

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_bfop_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int arg;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 arg1;
  byte bVar1;
  ushort uVar2;
  uint16_t uVar3;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  sbyte sVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t o_2;
  uint arg2;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i32 local_70;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar3 = read_im16(env,s);
  arg1 = tcg_ctx->cpu_dregs[insn & 7];
  uVar6 = uVar3 - 1 & 0x1f;
  uVar2 = uVar3 >> 6;
  uVar5 = insn & 0xf00;
  if (uVar5 == 0xd00) {
    local_70 = tcg_temp_new_i32(tcg_ctx);
    ret = tcg_temp_new_i32(tcg_ctx);
  }
  else {
    ret = (TCGv_i32)0x0;
    local_70 = (TCGv_i32)0x0;
  }
  arg = uVar6 + 1;
  arg2 = uVar2 & 0x1f;
  sVar4 = (sbyte)uVar6;
  if ((uVar3 & 0x820) == 0) {
    if (arg + arg2 < 0x21) {
      tcg_gen_shli_i32_m68k(tcg_ctx,QREG_CC_N,arg1,arg2);
    }
    else {
      tcg_gen_rotli_i32_m68k(tcg_ctx,QREG_CC_N,arg1,arg2);
    }
    tcg_gen_andi_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_N,-0x80000000 >> sVar4);
    bVar1 = (byte)uVar2 & 0x1f;
    ret_01 = tcg_const_i32_m68k(tcg_ctx,(0x7fffffffU >> sVar4) >> bVar1 |
                                        (0x7fffffffU >> sVar4) << 0x20 - bVar1);
    if (local_70 != (TCGv_i32)0x0) {
      tcg_gen_movi_i32(tcg_ctx,local_70,arg2);
      tcg_gen_movi_i32(tcg_ctx,ret,arg);
    }
  }
  else {
    ret_00 = tcg_temp_new_i32(tcg_ctx);
    if ((uVar3 & 0x20) == 0) {
      ret_01 = tcg_const_i32_m68k(tcg_ctx,0x7fffffff >> sVar4);
      if (ret != (TCGv_i32)0x0) {
        tcg_gen_movi_i32(tcg_ctx,ret,arg);
      }
    }
    else {
      tcg_gen_subi_i32_m68k(tcg_ctx,ret_00,tcg_ctx->cpu_dregs[uVar3 & 7],1);
      tcg_gen_andi_i32_m68k(tcg_ctx,ret_00,ret_00,0x1f);
      ret_01 = tcg_const_i32_m68k(tcg_ctx,0x7fffffff);
      tcg_gen_shr_i32(tcg_ctx,ret_01,ret_01,ret_00);
      if (ret != (TCGv_i32)0x0) {
        tcg_gen_addi_i32_m68k(tcg_ctx,ret,ret_00,1);
      }
    }
    if ((uVar3 >> 0xb & 1) == 0) {
      tcg_gen_rotli_i32_m68k(tcg_ctx,QREG_CC_N,arg1,arg2);
      tcg_gen_andc_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_N,ret_01);
      tcg_gen_rotri_i32_m68k(tcg_ctx,ret_01,ret_01,arg2);
      if (local_70 != (TCGv_i32)0x0) {
        tcg_gen_movi_i32(tcg_ctx,local_70,arg2);
      }
    }
    else {
      tcg_gen_andi_i32_m68k(tcg_ctx,ret_00,tcg_ctx->cpu_dregs[uVar2 & 7],0x1f);
      tcg_gen_rotl_i32_m68k(tcg_ctx,QREG_CC_N,arg1,ret_00);
      tcg_gen_andc_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_N,ret_01);
      tcg_gen_rotr_i32_m68k(tcg_ctx,ret_01,ret_01,ret_00);
      if (local_70 != (TCGv_i32)0x0) {
        tcg_gen_mov_i32(tcg_ctx,local_70,ret_00);
      }
    }
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  }
  set_cc_op(s,CC_OP_LOGIC);
  switch(uVar5 - 0x800 >> 8) {
  case 0:
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
               ,0x1107,(char *)0x0);
  case 2:
    tcg_gen_eqv_i32_m68k(tcg_ctx,arg1,arg1,ret_01);
    break;
  case 4:
    tcg_gen_and_i32(tcg_ctx,arg1,arg1,ret_01);
    break;
  case 5:
    local_48 = (TCGTemp *)(QREG_CC_N + (long)tcg_ctx);
    local_40 = (TCGTemp *)(local_70 + (long)tcg_ctx);
    local_38 = (TCGTemp *)(ret + (long)tcg_ctx);
    tcg_gen_callN_m68k(tcg_ctx,helper_bfffo_reg_m68k,
                       (TCGTemp *)
                       ((long)&tcg_ctx->pool_cur +
                       *(long *)((long)tcg_ctx->cpu_dregs + (ulong)(uVar3 >> 9 & 0x38))),3,&local_48
                      );
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(local_70 + (long)tcg_ctx));
    break;
  case 6:
    tcg_gen_orc_i32_m68k(tcg_ctx,arg1,arg1,ret_01);
  }
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(bfop_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    TCGv src = DREG(insn, 0);
    int len = ((extract32(ext, 0, 5) - 1) & 31) + 1;
    int ofs = extract32(ext, 6, 5);  /* big bit-endian */
    TCGv mask, tofs, tlen;

    tofs = NULL;
    tlen = NULL;
    if ((insn & 0x0f00) == 0x0d00) { /* bfffo */
        tofs = tcg_temp_new(tcg_ctx);
        tlen = tcg_temp_new(tcg_ctx);
    }

    if ((ext & 0x820) == 0) {
        /* Immediate width and offset.  */
        uint32_t maski = 0x7fffffffu >> (len - 1);
        if (ofs + len <= 32) {
            tcg_gen_shli_i32(tcg_ctx, QREG_CC_N, src, ofs);
        } else {
            tcg_gen_rotli_i32(tcg_ctx, QREG_CC_N, src, ofs);
        }
        tcg_gen_andi_i32(tcg_ctx, QREG_CC_N, QREG_CC_N, ~maski);
        mask = tcg_const_i32(tcg_ctx, ror32(maski, ofs));
        if (tofs) {
            tcg_gen_movi_i32(tcg_ctx, tofs, ofs);
            tcg_gen_movi_i32(tcg_ctx, tlen, len);
        }
    } else {
        TCGv tmp = tcg_temp_new(tcg_ctx);
        if (ext & 0x20) {
            /* Variable width */
            tcg_gen_subi_i32(tcg_ctx, tmp, DREG(ext, 0), 1);
            tcg_gen_andi_i32(tcg_ctx, tmp, tmp, 31);
            mask = tcg_const_i32(tcg_ctx, 0x7fffffffu);
            tcg_gen_shr_i32(tcg_ctx, mask, mask, tmp);
            if (tlen) {
                tcg_gen_addi_i32(tcg_ctx, tlen, tmp, 1);
            }
        } else {
            /* Immediate width */
            mask = tcg_const_i32(tcg_ctx, 0x7fffffffu >> (len - 1));
            if (tlen) {
                tcg_gen_movi_i32(tcg_ctx, tlen, len);
            }
        }
        if (ext & 0x800) {
            /* Variable offset */
            tcg_gen_andi_i32(tcg_ctx, tmp, DREG(ext, 6), 31);
            tcg_gen_rotl_i32(tcg_ctx, QREG_CC_N, src, tmp);
            tcg_gen_andc_i32(tcg_ctx, QREG_CC_N, QREG_CC_N, mask);
            tcg_gen_rotr_i32(tcg_ctx, mask, mask, tmp);
            if (tofs) {
                tcg_gen_mov_i32(tcg_ctx, tofs, tmp);
            }
        } else {
            /* Immediate offset (and variable width) */
            tcg_gen_rotli_i32(tcg_ctx, QREG_CC_N, src, ofs);
            tcg_gen_andc_i32(tcg_ctx, QREG_CC_N, QREG_CC_N, mask);
            tcg_gen_rotri_i32(tcg_ctx, mask, mask, ofs);
            if (tofs) {
                tcg_gen_movi_i32(tcg_ctx, tofs, ofs);
            }
        }
        tcg_temp_free(tcg_ctx, tmp);
    }
    set_cc_op(s, CC_OP_LOGIC);

    switch (insn & 0x0f00) {
    case 0x0a00: /* bfchg */
        tcg_gen_eqv_i32(tcg_ctx, src, src, mask);
        break;
    case 0x0c00: /* bfclr */
        tcg_gen_and_i32(tcg_ctx, src, src, mask);
        break;
    case 0x0d00: /* bfffo */
        gen_helper_bfffo_reg(tcg_ctx, DREG(ext, 12), QREG_CC_N, tofs, tlen);
        tcg_temp_free(tcg_ctx, tlen);
        tcg_temp_free(tcg_ctx, tofs);
        break;
    case 0x0e00: /* bfset */
        tcg_gen_orc_i32(tcg_ctx, src, src, mask);
        break;
    case 0x0800: /* bftst */
        /* flags already set; no other work to do.  */
        break;
    default:
        g_assert_not_reached();
    }
    tcg_temp_free(tcg_ctx, mask);
}